

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_16(QPDF *pdf,char *arg2)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  const_reference pvVar4;
  size_type sVar5;
  QPDFWriter local_1c8 [8];
  QPDFWriter w;
  QPDFObjGen local_1b8;
  QPDFObjGen local_1b0;
  size_type local_1a8;
  QPDFObjectHandle local_1a0;
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [32];
  undefined1 local_118 [8];
  QPDFObjectHandle kids;
  string local_100 [32];
  undefined1 local_e0 [8];
  QPDFObjectHandle pages;
  QPDFObjectHandle root;
  string local_b8 [32];
  QPDFObjectHandle local_98;
  QPDFObjectHandle local_88;
  undefined1 local_78 [8];
  QPDFObjectHandle page;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  QPDFObjectHandle contents;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *all_pages;
  char *arg2_local;
  QPDF *pdf_local;
  
  bVar1 = QPDF::everCalledGetAllPages();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!pdf.everCalledGetAllPages()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2e9,"void test_16(QPDF &, const char *)");
  }
  contents.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QPDF::getAllPages();
  uVar3 = QPDF::everCalledGetAllPages();
  if ((uVar3 & 1) == 0) {
    __assert_fail("pdf.everCalledGetAllPages()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2eb,"void test_16(QPDF &, const char *)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"New page 10",&local_51);
  createPageContents((QPDF *)local_30,(string *)pdf);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  pvVar4 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                      contents.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,0
                     );
  QPDFObjectHandle::QPDFObjectHandle(&local_98,pvVar4);
  QPDFObjectHandle::shallowCopy();
  QPDF::makeIndirectObject((QPDFObjectHandle *)local_78);
  QPDFObjectHandle::~QPDFObjectHandle(&local_88);
  QPDFObjectHandle::~QPDFObjectHandle(&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"/Contents",
             (allocator<char> *)
             ((long)&root.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::replaceKey((string *)local_78,(QPDFObjectHandle *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"/Pages",
             (allocator<char> *)
             ((long)&kids.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&kids.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"/Kids",&local_139);
  QPDFObjectHandle::getKey((string *)local_118);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"/Parent",&local_161);
  QPDFObjectHandle::replaceKey((string *)local_78,(QPDFObjectHandle *)local_160);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"/Count",&local_189);
  local_1a8 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                        ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                         contents.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
  QIntC::to_longlong<unsigned_long>(&local_1a8);
  QPDFObjectHandle::newInteger((longlong)&local_1a0);
  QPDFObjectHandle::replaceKey((string *)local_e0,(QPDFObjectHandle *)local_188);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1a0);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_118);
  sVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     contents.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  if (sVar5 != 10) {
    __assert_fail("all_pages.size() == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2f9,"void test_16(QPDF &, const char *)");
  }
  QPDF::updateAllPagesCache();
  bVar1 = QPDF::everCalledGetAllPages();
  if ((bVar1 & 1) == 0) {
    __assert_fail("pdf.everCalledGetAllPages()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2fb,"void test_16(QPDF &, const char *)");
  }
  sVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     contents.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  if (sVar5 != 0xb) {
    __assert_fail("all_pages.size() == 11",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2fc,"void test_16(QPDF &, const char *)");
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::back
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             contents.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  local_1b0 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  local_1b8 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  bVar2 = QPDFObjGen::operator==(&local_1b0,&local_1b8);
  if (!bVar2) {
    __assert_fail("all_pages.back().getObjGen() == page.getObjGen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2fd,"void test_16(QPDF &, const char *)");
  }
  QPDFWriter::QPDFWriter(local_1c8,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(local_1c8,0));
  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)local_1c8);
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_1c8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_118);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e0);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &pages.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  return;
}

Assistant:

static void
test_16(QPDF& pdf, char const* arg2)
{
    // Insert a page manually and then update the cache.
    assert(!pdf.everCalledGetAllPages());
    std::vector<QPDFObjectHandle> const& all_pages = pdf.getAllPages();
    assert(pdf.everCalledGetAllPages());

    QPDFObjectHandle contents = createPageContents(pdf, "New page 10");
    QPDFObjectHandle page = pdf.makeIndirectObject(QPDFObjectHandle(all_pages.at(0)).shallowCopy());
    page.replaceKey("/Contents", contents);

    // Insert the page manually.
    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle pages = root.getKey("/Pages");
    QPDFObjectHandle kids = pages.getKey("/Kids");
    page.replaceKey("/Parent", pages);
    pages.replaceKey(
        "/Count", QPDFObjectHandle::newInteger(1 + QIntC::to_longlong(all_pages.size())));
    kids.appendItem(page);
    assert(all_pages.size() == 10);
    pdf.updateAllPagesCache();
    assert(pdf.everCalledGetAllPages());
    assert(all_pages.size() == 11);
    assert(all_pages.back().getObjGen() == page.getObjGen());

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}